

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

fio_protocol_s * fio_protocol_try_lock(intptr_t uuid,fio_protocol_lock_e type)

{
  uint uVar1;
  fio_protocol_s *pfVar2;
  int *piVar3;
  
  if (-1 < uuid) {
    uVar1 = (uint)((ulong)uuid >> 8);
    if ((uVar1 < fio_data->capa) &&
       (*(char *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d) == (char)uuid)) {
      pfVar2 = protocol_try_lock((long)(int)uVar1,type);
      return pfVar2;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 9;
  return (fio_protocol_s *)0x0;
}

Assistant:

fio_protocol_s *fio_protocol_try_lock(intptr_t uuid,
                                      enum fio_protocol_lock_e type) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return NULL;
  }
  return protocol_try_lock(fio_uuid2fd(uuid), type);
}